

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_mul_integer_into(mp_int *r,mp_int *a,uint16_t n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  BignumInt BVar3;
  BignumDblInt MUL_temp;
  BignumInt aword;
  size_t i;
  BignumInt mult;
  BignumInt carry;
  uint16_t n_local;
  mp_int *a_local;
  mp_int *r_local;
  
  mult = 0;
  for (aword = 0; auVar2._8_8_ = 0, auVar2._0_8_ = mult, aword < r->nw; aword = aword + 1) {
    BVar3 = mp_word(a,aword);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = BVar3;
    auVar2 = auVar1 * ZEXT216(n) + auVar2;
    mult = auVar2._8_8_;
    r->w[aword] = auVar2._0_8_;
  }
  if (mult == 0) {
    return;
  }
  __assert_fail("!carry",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x360,"void mp_mul_integer_into(mp_int *, mp_int *, uint16_t)");
}

Assistant:

void mp_mul_integer_into(mp_int *r, mp_int *a, uint16_t n)
{
    BignumInt carry = 0, mult = n;
    for (size_t i = 0; i < r->nw; i++) {
        BignumInt aword = mp_word(a, i);
        BignumMULADD(carry, r->w[i], aword, mult, carry);
    }
    assert(!carry);
}